

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  int p1;
  int op;
  Vdbe *p;
  
  if ((pExpr == (Expr *)0x0) || (pExpr->op != 0xa8)) {
    p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
    if ((p1 == target) || (p = pParse->pVdbe, p == (Vdbe *)0x0)) {
      return;
    }
    op = 0x4f;
  }
  else {
    p = pParse->pVdbe;
    p1 = pExpr->iTable;
    op = 0x4e;
  }
  sqlite3VdbeAddOp2(p,op,p1,target);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( target>0 && target<=pParse->nMem );
  if( pExpr && pExpr->op==TK_REGISTER ){
    sqlite3VdbeAddOp2(pParse->pVdbe, OP_Copy, pExpr->iTable, target);
  }else{
    inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
    assert( pParse->pVdbe!=0 || pParse->db->mallocFailed );
    if( inReg!=target && pParse->pVdbe ){
      sqlite3VdbeAddOp2(pParse->pVdbe, OP_SCopy, inReg, target);
    }
  }
}